

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kriging.cpp
# Opt level: O3

tuple<double,_arma::Col<double>_> * __thiscall
Kriging::logMargPostFun
          (tuple<double,_arma::Col<double>_> *__return_storage_ptr__,Kriging *this,vec *_theta,
          bool _grad,bool _bench)

{
  undefined8 uVar1;
  uhword uVar2;
  double *pdVar3;
  bool bVar4;
  uint uVar5;
  char (*pacVar6) [39];
  uint uVar7;
  undefined7 in_register_00000081;
  uword uVar8;
  undefined1 auVar9 [16];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  bench;
  Mat<double> local_758;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  local_6a8;
  KModel local_678;
  
  local_758.n_rows = 0;
  local_758.n_cols = 1;
  local_758.n_elem = 0;
  local_758.n_alloc = 0;
  local_758.vec_state = 1;
  local_758.mem_state = 0;
  local_758.mem = (double *)0x0;
  if ((int)CONCAT71(in_register_00000081,_bench) == 0) {
    if (!_grad) goto LAB_00135c58;
    local_678.R.n_elem = (_theta->super_Mat<double>).n_elem;
    local_678.R.n_cols = 1;
    local_678.R.n_rows = local_678.R.n_elem;
    local_678.R.n_alloc = 0;
    local_678.R.vec_state = 1;
    local_678.R.mem_state = 0;
    local_678.R.mem = (double *)0x0;
    if ((ulong)local_678.R.n_elem < 0x11) {
      uVar8 = 0;
      pdVar3 = (double *)0x0;
      if (local_678.R.n_elem != 0) {
        pdVar3 = local_678.R.mem_local;
      }
    }
    else {
      pacVar6 = (char (*) [39])((ulong)local_678.R.n_elem << 3);
      pdVar3 = (double *)lkalloc::malloc((size_t)pacVar6);
      uVar8 = local_678.R.n_elem;
      if (pdVar3 == (double *)0x0) {
        arma::arma_stop_bad_alloc<char[39]>(pacVar6);
      }
    }
    uVar7 = 0;
    local_678.R.n_alloc = uVar8;
    local_678.R.mem = pdVar3;
    if (local_678.R.n_elem != 0) {
      memset(pdVar3,0,(ulong)local_678.R.n_elem << 3);
      uVar7 = local_678.R.n_elem;
    }
    uVar2 = local_678.R.mem_state;
    uVar8 = local_678.R.n_alloc;
    uVar1 = local_678.R._0_8_;
    bVar4 = true;
    uVar5 = (uint)local_678.R.vec_state;
    if ((local_758.vec_state != local_678.R.vec_state) &&
       (local_758.vec_state != 1 || local_678.R.n_cols != 1)) {
      bVar4 = local_678.R.n_rows == 1 && local_758.vec_state == 2;
    }
    if (((bVar4) && (local_758.mem_state < 2)) &&
       ((ushort)(local_678.R.mem_state - 1) < 2 || 0x10 < local_678.R.n_alloc)) {
      arma::Mat<double>::init_warm
                (&local_758,(uint)(local_758.vec_state == 2),(uint)(local_758.vec_state == 1));
      local_678.R.n_rows = (uword)uVar1;
      local_678.R.n_cols = SUB84(uVar1,4);
      local_758.n_rows = local_678.R.n_rows;
      local_758.n_cols = local_678.R.n_cols;
      local_758.n_alloc = uVar8;
      local_758.n_elem = uVar7;
      local_758.mem_state = uVar2;
      auVar9 = pshuflw(ZEXT416(uVar5),ZEXT416(uVar5),0);
      local_678.R._0_8_ =
           CONCAT26(-(ushort)(auVar9._6_2_ == 0),
                    CONCAT24(-(ushort)(auVar9._4_2_ == 1),
                             CONCAT22(-(ushort)(auVar9._2_2_ == 1),-(ushort)(auVar9._0_2_ == 2)))) &
           (ulong)DAT_001a6290;
      local_758.mem = local_678.R.mem;
      local_678.R.n_alloc = 0;
      local_678.R.mem_state = 0;
LAB_00135c30:
      local_678.R.n_elem = 0;
      local_678.R.mem = (double *)0x0;
    }
    else {
      arma::Mat<double>::init_warm(&local_758,local_678.R.n_rows,local_678.R.n_cols);
      if (local_758.mem != local_678.R.mem && (ulong)local_678.R.n_elem != 0) {
        memcpy(local_758.mem,local_678.R.mem,(ulong)local_678.R.n_elem << 3);
      }
      if (uVar8 < 0x11 && uVar2 == 0) {
        auVar9 = pshuflw(ZEXT416(uVar5),ZEXT416(uVar5),0);
        local_678.R._0_8_ =
             CONCAT26(-(ushort)(auVar9._6_2_ == 0),
                      CONCAT24(-(ushort)(auVar9._4_2_ == 1),
                               CONCAT22(-(ushort)(auVar9._2_2_ == 1),-(ushort)(auVar9._0_2_ == 2))))
             & (ulong)DAT_001a6290;
        goto LAB_00135c30;
      }
    }
    if ((local_678.R.n_alloc != 0) && (local_678.R.mem != (double *)0x0)) {
      lkalloc::free(local_678.R.mem);
    }
LAB_00135c58:
    make_Model(&local_678,this,_theta,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                *)0x0);
  }
  local_6a8._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_6a8._M_t._M_impl.super__Rb_tree_header._M_header;
  local_6a8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_6a8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_6a8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_6a8._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_6a8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (!_grad) goto LAB_00135b98;
  local_678.R.n_elem = (_theta->super_Mat<double>).n_elem;
  local_678.R.n_cols = 1;
  local_678.R.n_rows = local_678.R.n_elem;
  local_678.R.n_alloc = 0;
  local_678.R.vec_state = 1;
  local_678.R.mem_state = 0;
  local_678.R.mem = (double *)0x0;
  if ((ulong)local_678.R.n_elem < 0x11) {
    uVar8 = 0;
    pdVar3 = (double *)0x0;
    if (local_678.R.n_elem != 0) {
      pdVar3 = local_678.R.mem_local;
    }
  }
  else {
    pacVar6 = (char (*) [39])((ulong)local_678.R.n_elem << 3);
    pdVar3 = (double *)lkalloc::malloc((size_t)pacVar6);
    uVar8 = local_678.R.n_elem;
    if (pdVar3 == (double *)0x0) {
      arma::arma_stop_bad_alloc<char[39]>(pacVar6);
    }
  }
  uVar7 = 0;
  local_678.R.n_alloc = uVar8;
  local_678.R.mem = pdVar3;
  if (local_678.R.n_elem != 0) {
    memset(pdVar3,0,(ulong)local_678.R.n_elem << 3);
    uVar7 = local_678.R.n_elem;
  }
  uVar2 = local_678.R.mem_state;
  uVar8 = local_678.R.n_alloc;
  uVar1 = local_678.R._0_8_;
  bVar4 = true;
  uVar5 = (uint)local_678.R.vec_state;
  if ((local_758.vec_state != local_678.R.vec_state) &&
     (local_758.vec_state != 1 || local_678.R.n_cols != 1)) {
    bVar4 = local_678.R.n_rows == 1 && local_758.vec_state == 2;
  }
  if (((bVar4) && (local_758.mem_state < 2)) &&
     ((ushort)(local_678.R.mem_state - 1) < 2 || 0x10 < local_678.R.n_alloc)) {
    arma::Mat<double>::init_warm
              (&local_758,(uint)(local_758.vec_state == 2),(uint)(local_758.vec_state == 1));
    local_678.R.n_rows = (uword)uVar1;
    local_678.R.n_cols = SUB84(uVar1,4);
    local_758.n_rows = local_678.R.n_rows;
    local_758.n_cols = local_678.R.n_cols;
    local_758.n_alloc = uVar8;
    local_758.n_elem = uVar7;
    local_758.mem_state = uVar2;
    auVar9 = pshuflw(ZEXT416(uVar5),ZEXT416(uVar5),0);
    local_678.R._0_8_ =
         CONCAT26(-(ushort)(auVar9._6_2_ == 0),
                  CONCAT24(-(ushort)(auVar9._4_2_ == 1),
                           CONCAT22(-(ushort)(auVar9._2_2_ == 1),-(ushort)(auVar9._0_2_ == 2)))) &
         (ulong)DAT_001a6290;
    local_758.mem = local_678.R.mem;
    local_678.R.n_alloc = 0;
    local_678.R.mem_state = 0;
LAB_00135b70:
    local_678.R.n_elem = 0;
    local_678.R.mem = (double *)0x0;
  }
  else {
    arma::Mat<double>::init_warm(&local_758,local_678.R.n_rows,local_678.R.n_cols);
    if (local_758.mem != local_678.R.mem && (ulong)local_678.R.n_elem != 0) {
      memcpy(local_758.mem,local_678.R.mem,(ulong)local_678.R.n_elem << 3);
    }
    if (uVar8 < 0x11 && uVar2 == 0) {
      auVar9 = pshuflw(ZEXT416(uVar5),ZEXT416(uVar5),0);
      local_678.R._0_8_ =
           CONCAT26(-(ushort)(auVar9._6_2_ == 0),
                    CONCAT24(-(ushort)(auVar9._4_2_ == 1),
                             CONCAT22(-(ushort)(auVar9._2_2_ == 1),-(ushort)(auVar9._0_2_ == 2)))) &
           (ulong)DAT_001a6290;
      goto LAB_00135b70;
    }
  }
  if ((local_678.R.n_alloc != 0) && (local_678.R.mem != (double *)0x0)) {
    lkalloc::free(local_678.R.mem);
  }
LAB_00135b98:
  make_Model(&local_678,this,_theta,&local_6a8);
}

Assistant:

LIBKRIGING_EXPORT std::tuple<double, arma::vec> Kriging::logMargPostFun(const arma::vec& _theta,
                                                                        const bool _grad,
                                                                        const bool _bench) {
  double lmp = -1;
  arma::vec grad;

  if (_bench) {
    std::map<std::string, double> bench;
    if (_grad) {
      grad = arma::vec(_theta.n_elem);
      lmp = _logMargPost(_theta, &grad, nullptr, &bench);
    } else
      lmp = _logMargPost(_theta, nullptr, nullptr, &bench);

    size_t num = 0;
    for (auto& kv : bench)
      num = std::max(kv.first.size(), num);
    for (auto& kv : bench)
      arma::cout << "| " << Bench::pad(kv.first, num, ' ') << " | " << kv.second << " |" << arma::endl;

  } else {
    if (_grad) {
      grad = arma::vec(_theta.n_elem);
      lmp = _logMargPost(_theta, &grad, nullptr, nullptr);
    } else
      lmp = _logMargPost(_theta, nullptr, nullptr, nullptr);
  }

  return std::make_tuple(lmp, std::move(grad));
}